

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O1

CommandSignature __thiscall llbuild::buildsystem::BuildNode::getSignature(BuildNode *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  CommandSignature sig;
  CommandSignature local_c8;
  StringRef local_c0;
  hash_combine_recursive_helper local_b0;
  
  local_c8.value = 0;
  llbuild::basic::CommandSignature::combine(&local_c8,this->type != Plain);
  ppCVar2 = (this->super_Node).producers.
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->super_Node).producers.
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 != ppCVar1) {
    do {
      local_c0.Data = ((*ppCVar2)->name)._M_dataplus._M_p;
      local_c0.Length = ((*ppCVar2)->name)._M_string_length;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer[0] = (undefined1)local_c8.value;
      local_b0.buffer[1] = local_c8.value._1_1_;
      local_b0.buffer[2] = local_c8.value._2_1_;
      local_b0.buffer[3] = local_c8.value._3_1_;
      local_b0.buffer[4] = local_c8.value._4_1_;
      local_b0.buffer[5] = local_c8.value._5_1_;
      local_b0.buffer[6] = local_c8.value._6_1_;
      local_b0.buffer[7] = local_c8.value._7_1_;
      local_c8.value =
           (uint64_t)
           llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                     (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      ppCVar2 = ppCVar2 + 1;
    } while (ppCVar2 != ppCVar1);
  }
  return (CommandSignature)local_c8.value;
}

Assistant:

basic::CommandSignature BuildNode::getSignature() const {
  basic::CommandSignature sig;
  sig.combine(static_cast<unsigned int>(type));
  // We include the name of all producer rules in the signature to ensure that
  // we properly pick up changes in build graph structure.  For example, a node
  // that was previously a plain input that has changed to become a produced
  // node.
  for (auto* producer : getProducers()) {
    sig.combine(producer->getName());
  }
  return sig;
}